

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlBufferPtr xmlBufferCreateStatic(void *mem,size_t size)

{
  xmlBufferPtr ret;
  size_t size_local;
  void *mem_local;
  
  if ((mem == (void *)0x0) || (size == 0)) {
    mem_local = (void *)0x0;
  }
  else if (size < 0x100000000) {
    mem_local = (*xmlMalloc)(0x20);
    if ((undefined8 *)mem_local == (undefined8 *)0x0) {
      xmlTreeErrMemory("creating buffer");
      mem_local = (void *)0x0;
    }
    else {
      *(int *)((long)mem_local + 8) = (int)size;
      *(int *)((long)mem_local + 0xc) = (int)size;
      *(undefined4 *)((long)mem_local + 0x10) = 2;
      *(void **)mem_local = mem;
    }
  }
  else {
    mem_local = (void *)0x0;
  }
  return (xmlBufferPtr)mem_local;
}

Assistant:

xmlBufferPtr
xmlBufferCreateStatic(void *mem, size_t size) {
    xmlBufferPtr ret;

    if ((mem == NULL) || (size == 0))
        return(NULL);
    if (size > UINT_MAX)
        return(NULL);

    ret = (xmlBufferPtr) xmlMalloc(sizeof(xmlBuffer));
    if (ret == NULL) {
	xmlTreeErrMemory("creating buffer");
        return(NULL);
    }
    ret->use = size;
    ret->size = size;
    ret->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
    ret->content = (xmlChar *) mem;
    return(ret);
}